

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O0

void __thiscall Js::ByteCodeCache::Initialize(ByteCodeCache *this,ScriptContext *scriptContext)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar1;
  int *piVar2;
  uchar **ppuVar3;
  byte *local_b0;
  byte *ptr;
  byte *pbStack_a0;
  uint i_2;
  byte *current;
  undefined8 local_90;
  TrackAllocData local_88;
  int local_60;
  int local_5c;
  int i_1;
  int i;
  undefined8 local_50;
  TrackAllocData local_48;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *local_20;
  ArenaAllocator *alloc;
  ScriptContext *scriptContext_local;
  ByteCodeCache *this_local;
  
  alloc = (ArenaAllocator *)scriptContext;
  scriptContext_local = (ScriptContext *)this;
  pAVar1 = &ScriptContext::SourceCodeAllocator(scriptContext)->
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  this->propertyCount = this->reader->string16Count;
  local_20 = pAVar1;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&int::typeinfo,0,(long)this->propertyCount,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
             ,0x12f4);
  pAVar1 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar1,&local_48);
  _i_1 = Memory::ArenaAllocator::Alloc;
  local_50 = 0;
  piVar2 = Memory::AllocateArray<Memory::ArenaAllocator,int,false>
                     ((Memory *)pAVar1,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                      (long)this->propertyCount);
  this->propertyIds = piVar2;
  for (local_5c = 0; local_5c < this->propertyCount; local_5c = local_5c + 1) {
    this->propertyIds[local_5c] = -1;
  }
  this->raw = this->reader->raw;
  for (local_60 = 0; pAVar1 = local_20, local_60 < this->propertyCount; local_60 = local_60 + 1) {
    PopulateLookupPropertyId(this,(ScriptContext *)alloc,local_60);
  }
  this->scopeInfoCount = this->reader->scopeInfoCount;
  if (this->scopeInfoCount != 0) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_88,(type_info *)&unsigned_char_const*::typeinfo,0,(ulong)this->scopeInfoCount,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
               ,0x1305);
    pAVar1 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar1,&local_88);
    current = (byte *)Memory::ArenaAllocator::Alloc;
    local_90 = 0;
    ppuVar3 = Memory::AllocateArray<Memory::ArenaAllocator,unsigned_char_const*,false>
                        ((Memory *)pAVar1,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                         (ulong)this->scopeInfoCount);
    this->scopeInfoRelativeOffsets = ppuVar3;
    pbStack_a0 = this->reader->scopeInfoRelativeOffsets;
    for (ptr._4_4_ = 0; ptr._4_4_ < this->scopeInfoCount; ptr._4_4_ = ptr._4_4_ + 1) {
      local_b0 = (byte *)0x0;
      pbStack_a0 = ByteCodeBufferReader::ReadOffsetAsPointer(this->reader,pbStack_a0,&local_b0);
      this->scopeInfoRelativeOffsets[ptr._4_4_] = local_b0;
    }
  }
  return;
}

Assistant:

void ByteCodeCache::Initialize(ScriptContext * scriptContext)
{
    auto alloc = scriptContext->SourceCodeAllocator();
    propertyCount = reader->string16Count;
    propertyIds = AnewArray(alloc, PropertyId, propertyCount);
    for (auto i = 0; i < propertyCount; ++i)
    {
        propertyIds[i] = -1;
    }

    raw = reader->raw;

    // Read and populate PropertyIds
    for (int i = 0; i < propertyCount; ++i)
    {
        PopulateLookupPropertyId(scriptContext, i);
    }

    scopeInfoCount = reader->scopeInfoCount;
    if (scopeInfoCount > 0)
    {
        scopeInfoRelativeOffsets = AnewArray(alloc, const byte*, scopeInfoCount);

        const byte* current = reader->scopeInfoRelativeOffsets;
        for (uint i = 0; i < scopeInfoCount; i++)
        {
            const byte* ptr = nullptr;
            current = reader->ReadOffsetAsPointer(current, &ptr);

            scopeInfoRelativeOffsets[i] = ptr;
        }
    }
}